

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_remainder(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *ext2;
  vm_datatype_t *pvVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  char *new_ext;
  char *new_rem_ext;
  vm_val_t *pvVar4;
  CVmObjList *this_00;
  vm_val_t val2;
  vm_val_t quo_val;
  vm_val_t rem_val;
  vm_val_t local_68;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_remainder();
  }
  pvVar4 = retval;
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_remainder::desc);
  if (iVar2 == 0) {
    local_68.typ = sp_[-1].typ;
    local_68._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_68.val = sp_[-1].val;
    sp_ = sp_ + -1;
    iVar2 = cvt_to_bignum((CVmObjBigNum *)pvVar4,self,&local_68);
    pvVar4 = sp_;
    if (iVar2 == 0) {
      err_throw(0x900);
    }
    ext2 = *(char **)((long)&G_obj_table_X.pages_[local_68.val.obj >> 0xc][local_68.val.obj & 0xfff]
                             .ptr_ + 8);
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar4->val).obj = self;
    pvVar4 = sp_;
    sp_ = sp_ + 1;
    pvVar4->typ = local_68.typ;
    *(undefined4 *)&pvVar4->field_0x4 = local_68._4_4_;
    pvVar4->val = local_68.val;
    new_ext = compute_init_2op(&local_50,(this->super_CVmObject).ext_,ext2);
    pvVar4 = sp_;
    sp_ = sp_ + 1;
    pvVar4->typ = local_50.typ;
    *(undefined4 *)&pvVar4->field_0x4 = local_50._4_4_;
    pvVar4->val = local_50.val;
    new_rem_ext = compute_init_2op(&local_40,(this->super_CVmObject).ext_,ext2);
    pvVar4 = sp_;
    sp_ = sp_ + 1;
    pvVar4->typ = local_40.typ;
    *(undefined4 *)&pvVar4->field_0x4 = local_40._4_4_;
    pvVar4->val = local_40.val;
    vVar3 = CVmObjList::create(0,2);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    this_00 = (CVmObjList *)
              ((long)&G_obj_table_X.pages_[vVar3 >> 0xc]->ptr_ + (ulong)((vVar3 & 0xfff) * 0x18));
    CVmObjList::cons_set_element(this_00,0,&local_50);
    CVmObjList::cons_set_element(this_00,1,&local_40);
    compute_quotient_into(new_ext,new_rem_ext,(this->super_CVmObject).ext_,ext2);
    sp_ = sp_ + -4;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_remainder(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *ext2;
    char *quo_ext;
    char *rem_ext;
    vm_val_t rem_val;
    vm_val_t quo_val;
    CVmObjList *lst;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the divisor */
    G_stk->pop(&val2);

    /* convert it to BigNumber */
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* it's not a BigNumber - throw an error */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* get the divisor's extension */
    ext2 = get_objid_ext(vmg_ val2.val.obj);

    /* push 'self' and the other value to protect against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* create a quotient result value, and push it for safekeeping */
    quo_ext = compute_init_2op(vmg_ &quo_val, ext_, ext2);
    G_stk->push(&quo_val);

    /* create a remainder result value, and push it for safekeeping */
    rem_ext = compute_init_2op(vmg_ &rem_val, ext_, ext2);
    G_stk->push(&rem_val);

    /* 
     *   create a list for the return value - it will have two elements:
     *   the quotient and the remainder 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 2));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    lst->cons_set_element(0, &quo_val);
    lst->cons_set_element(1, &rem_val);

    /* calculate the quotient */
    compute_quotient_into(quo_ext, rem_ext, ext_, ext2);

    /* remove the GC protection */
    G_stk->discard(4);

    /* handled */
    return TRUE;
}